

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateRows(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *__x;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *__x_00;
  int *piVar1;
  uint *puVar2;
  double a;
  undefined1 auVar3 [16];
  char cVar4;
  int iVar5;
  Item *pIVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  undefined8 uVar8;
  Tolerances *pTVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  DataKey *pDVar11;
  pointer pnVar12;
  undefined8 uVar13;
  bool bVar14;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pDVar15;
  undefined1 uVar16;
  bool bVar17;
  Result RVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  pointer pnVar23;
  DuplicateRowsPS *pDVar24;
  SPxOut *pSVar25;
  byte bVar26;
  long lVar27;
  pointer pDVar28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pDVar33;
  ulong uVar34;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar35;
  uint uVar36;
  int *piVar37;
  cpp_dec_float<50U,_int,_void> *pcVar38;
  long lVar39;
  ulong uVar40;
  long in_FS_OFFSET;
  bool bVar41;
  Real RVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  Verbosity old_verbosity;
  undefined1 auStack_774 [12];
  uint local_768 [3];
  undefined3 uStack_75b;
  uint local_758;
  undefined3 uStack_753;
  int local_750;
  bool local_74c;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_748;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_738;
  byte local_729;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  int *perm_tmp;
  int *perm;
  uint auStack_6d0 [5];
  undefined3 uStack_6bb;
  uint local_6b8;
  undefined3 uStack_6b3;
  int local_6b0;
  bool local_6ac;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6a8;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined1 local_688 [48];
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_658;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_648;
  undefined8 uStack_640;
  long local_630;
  ulong local_628;
  DataArray<int> da_perm;
  DataArray<bool> isLhsEqualRhs;
  int *idxMem;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  int *local_558;
  uint auStack_550 [2];
  uint local_548 [2];
  uint auStack_540 [2];
  uint local_538 [2];
  int local_530;
  bool local_52c;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_528;
  int *local_518;
  uint auStack_510 [2];
  uint local_508 [2];
  uint auStack_500 [2];
  uint local_4f8 [2];
  int local_4f0;
  bool local_4ec;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4e8;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  ulong local_4a0;
  DataArray<bool> local_498;
  DataArray<bool> local_480;
  DataArray<int> pClass;
  int *local_448;
  uint auStack_440 [2];
  uint local_438 [2];
  uint auStack_430 [2];
  uint local_428 [2];
  int local_420;
  bool local_41c;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_418;
  cpp_dec_float<50U,_int,_void> local_408;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  DataArray<int> classSize;
  DataArray<bool> remRow;
  shared_ptr<soplex::Tolerances> local_388;
  shared_ptr<soplex::Tolerances> local_378;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newRhsVec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newLhsVec;
  DataArray<int> local_2f8;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_2e0;
  DataArray<int> local_2c8;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_2b0;
  undefined8 local_298;
  uint auStack_290 [4];
  undefined5 uStack_280;
  undefined3 uStack_27b;
  undefined8 local_278;
  int local_270;
  undefined1 local_26c;
  undefined8 local_268;
  undefined1 local_258 [16];
  undefined1 local_248 [13];
  undefined3 uStack_23b;
  undefined8 local_238;
  int local_230;
  char local_22c;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_228;
  int *local_218;
  uint auStack_210 [2];
  uint local_208 [2];
  uint auStack_200 [2];
  uint local_1f8 [4];
  int *local_1e8;
  uint auStack_1e0 [2];
  uint local_1d8 [2];
  uint auStack_1d0 [2];
  uint local_1c8 [4];
  int *local_1b8;
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198 [4];
  int *local_188;
  uint auStack_180 [2];
  uint local_178 [2];
  uint auStack_170 [2];
  uint local_168 [4];
  int *local_158;
  uint auStack_150 [2];
  uint local_148 [2];
  uint auStack_140 [2];
  uint local_138 [4];
  int *local_128;
  uint auStack_120 [2];
  uint local_118 [2];
  uint auStack_110 [2];
  uint local_108 [4];
  uint local_f8 [2];
  uint auStack_f0 [2];
  uint local_e8 [2];
  undefined8 uStack_e0;
  undefined8 local_d8;
  int *local_c8;
  uint auStack_c0 [2];
  uint local_b8 [2];
  undefined8 uStack_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar22 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  RVar18 = removeEmpty(this,lp);
  if (RVar18 == OKAY) {
    auVar3._12_4_ = 0;
    auVar3._0_12_ = auStack_774;
    _old_verbosity = auVar3 << 0x20;
    if ((lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum < 1) {
      iVar31 = 0;
    }
    else {
      iVar31 = 0;
      iVar19 = 0;
      do {
        pIVar6 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar19 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[iVar19].idx;
        if (pIVar6[iVar19].data.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused == 1) {
          removeRowSingleton(this,lp,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)(pIVar6 + iVar19),(int *)&old_verbosity);
          iVar31 = iVar31 + 1;
        }
        iVar19 = old_verbosity + WARNING;
        old_verbosity = iVar19;
      } while (iVar19 < (lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
    local_738 = lp;
    if (((0 < iVar31) &&
        (pSVar25 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout, pSVar25 != (SPxOut *)0x0)) && (3 < (int)pSVar25->m_verbosity)) {
      old_verbosity = pSVar25->m_verbosity;
      result_2.m_backend.data._M_elems[0] = 4;
      (*pSVar25->_vptr_SPxOut[2])();
      pSVar25 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar25->m_streams[pSVar25->m_verbosity],
                 "Simplifier duplicate rows (row singleton stage) removed ",0x38);
      std::ostream::operator<<((ostream *)pSVar25->m_streams[pSVar25->m_verbosity],iVar31);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar25->m_streams[pSVar25->m_verbosity]," rows, ",7);
      std::ostream::operator<<((ostream *)pSVar25->m_streams[pSVar25->m_verbosity],iVar31);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar25->m_streams[pSVar25->m_verbosity]," non-zeros",10);
      cVar4 = (char)pSVar25->m_streams[pSVar25->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar25->m_streams[pSVar25->m_verbosity] + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      pSVar25 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar25->_vptr_SPxOut[2])(pSVar25,&old_verbosity);
    }
    pSVar35 = local_738;
    pClass.thesize =
         (local_738->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thenum;
    RVar18 = OKAY;
    if (1 < pClass.thesize) {
      pClass.data = (int *)0x0;
      pClass.memFactor = 1.2;
      pClass.themax = pClass.thesize;
      spx_alloc<int*>(&pClass.data,pClass.thesize);
      iVar31 = (pSVar35->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      classSize.data = (int *)0x0;
      classSize.memFactor = 1.2;
      classSize.thesize = 0;
      if (0 < iVar31) {
        classSize.thesize = iVar31;
      }
      classSize.themax = 1;
      if (0 < iVar31) {
        classSize.themax = classSize.thesize;
      }
      spx_alloc<int*>(&classSize.data,classSize.themax);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array(&scale,(pSVar35->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(pSVar35->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum);
      piVar37 = idxMem;
      *pClass.data = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)
                 scale.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0.0);
      uVar36 = local_698._4_4_;
      *classSize.data =
           (local_738->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
      local_698 = (double)((ulong)local_698._4_4_ << 0x20);
      if (1 < (local_738->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar32 = 1;
        local_698 = (double)((ulong)uVar36 << 0x20);
        lVar39 = 0x38;
        do {
          pClass.data[lVar32] = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)
                     ((long)((scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar39),0.0);
          classSize.data[lVar32] = 0;
          piVar37[lVar32 + -1] = (int)lVar32;
          lVar32 = lVar32 + 1;
          local_698 = (double)CONCAT44(local_698._4_4_,(int)local_698 + 1);
          lVar39 = lVar39 + 0x38;
        } while (lVar32 < (local_738->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      local_268._0_4_ = cpp_dec_float_finite;
      local_268._4_4_ = 10;
      local_298._0_4_ = 0;
      local_298._4_4_ = 0;
      auStack_290[0] = 0;
      auStack_290[1] = 0;
      auStack_290[2] = 0;
      auStack_290[3] = 0;
      uStack_280 = 0;
      uStack_27b = 0;
      local_278 = 0;
      local_270 = 0;
      local_26c = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_298,0.0);
      local_6a0 = this;
      if (0 < (local_738->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar32 = 0;
        do {
          pIVar6 = (local_738->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem +
                   (local_738->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey[lVar32].idx;
          local_630 = lVar32;
          if (0 < (pIVar6->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            lVar39 = 0;
            lVar32 = 0;
            do {
              pnVar23 = scale.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pNVar7 = (pIVar6->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              uVar8 = *(undefined8 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar39 + 0x20);
              result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar8,0);
              result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
              puVar2 = (uint *)((long)(pNVar7->val).m_backend.data._M_elems + lVar39);
              result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              result_2.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              auVar3 = *(undefined1 (*) [16])
                        ((long)(pNVar7->val).m_backend.data._M_elems + lVar39 + 0x10);
              result_2.m_backend.data._M_elems._16_8_ = auVar3._0_8_;
              result_2.m_backend.data._M_elems._24_5_ = auVar3._8_5_;
              result_2.m_backend.data._M_elems[7]._1_3_ = auVar3._13_3_;
              result_2.m_backend.exp = *(int *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar39);
              result_2.m_backend.neg =
                   *(bool *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar39 + 4);
              result_2.m_backend._48_8_ =
                   *(undefined8 *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar39 + 8);
              iVar31 = *(int *)((long)(&((pIVar6->data).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar39);
              if (scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar31].m_backend.fpclass !=
                  cpp_dec_float_NaN) {
                local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0xa00000000;
                _old_verbosity = (undefined1  [16])0x0;
                local_768[0] = 0;
                local_768[1] = 0;
                stack0xfffffffffffff8a0 = 0;
                uStack_75b = 0;
                _local_758 = 0;
                uStack_753 = 0;
                local_750 = 0;
                local_74c = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&old_verbosity,0.0);
                iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&pnVar23[iVar31].m_backend,
                                    (cpp_dec_float<50U,_int,_void> *)&old_verbosity);
                if (iVar19 == 0) {
                  *(ulong *)(scale.data.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar31].m_backend.data.
                             _M_elems + 8) =
                       CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                                result_2.m_backend.data._M_elems._32_5_);
                  auVar46._8_5_ = result_2.m_backend.data._M_elems._24_5_;
                  auVar46._0_4_ = result_2.m_backend.data._M_elems[4];
                  auVar46._4_4_ = result_2.m_backend.data._M_elems[5];
                  auVar46._13_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
                  *(undefined1 (*) [16])
                   (scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar31].m_backend.data._M_elems + 4) =
                       auVar46;
                  *(undefined8 *)
                   scale.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar31].m_backend.data._M_elems =
                       result_2.m_backend.data._M_elems._0_8_;
                  *(undefined8 *)
                   (scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar31].m_backend.data._M_elems + 2) =
                       result_2.m_backend.data._M_elems._8_8_;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar31].m_backend.exp =
                       result_2.m_backend.exp;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar31].m_backend.neg =
                       result_2.m_backend.neg;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar31].m_backend.fpclass =
                       result_2.m_backend.fpclass;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar31].m_backend.prec_elem =
                       result_2.m_backend.prec_elem;
                }
              }
              iVar19 = pClass.data[iVar31];
              pDVar28 = (local_6a0->m_classSetRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0xa00000000;
              _old_verbosity = (undefined1  [16])0x0;
              local_768[0] = 0;
              local_768[1] = 0;
              stack0xfffffffffffff8a0 = 0;
              uStack_75b = 0;
              _local_758 = 0;
              uStack_753 = 0;
              local_750 = 0;
              local_74c = false;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&result_2.m_backend,
                         &scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar31].m_backend);
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add(pDVar28 + iVar19,iVar31,
                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&old_verbosity);
              piVar1 = classSize.data + pClass.data[iVar31];
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                lVar27 = (long)(int)local_698;
                local_698 = (double)CONCAT44(local_698._4_4_,(int)local_698 + 1);
                piVar37[lVar27] = pClass.data[iVar31];
              }
              lVar32 = lVar32 + 1;
              lVar39 = lVar39 + 0x3c;
            } while (lVar32 < (pIVar6->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .memused);
          }
          this = local_6a0;
          if (0 < (pIVar6->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            uVar40 = 0;
            do {
              pDVar33 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pClass.data
                                  [(pIVar6->data).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem[uVar40].idx] * 0x20);
              if (0 < *(int *)((long)&(pDVar33->
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).memused +
                              (long)(this->m_classSetRows).data.
                                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) {
                pTVar9 = (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var10 = (this->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                  }
                }
                RVar42 = Tolerances::epsilon(pTVar9);
                local_228 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0xa00000000;
                local_258 = (undefined1  [16])0x0;
                local_248 = SUB1613((undefined1  [16])0x0,0);
                uStack_23b = 0;
                local_238 = 0;
                local_230 = 0;
                local_22c = '\0';
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)local_258,RVar42);
                local_688._32_5_ = (undefined5)local_238;
                local_688._37_3_ = (undefined3)((ulong)local_238 >> 0x28);
                local_688._16_8_ = local_248._0_8_;
                local_688._24_5_ = local_248._8_5_;
                local_688._29_3_ = uStack_23b;
                local_688._0_8_ = local_258._0_8_;
                local_688._8_8_ = local_258._8_8_;
                local_688._40_4_ = local_230;
                local_688[0x2c] = local_22c;
                local_658 = local_228;
                if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
                }
                pDVar28 = (this->m_classSetRows).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar31 = *(int *)((long)&(pDVar33->
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).memused + (long)pDVar28);
                if (1 < iVar31) {
                  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                            (*(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               **)((long)&(pDVar33->
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).m_elem + (long)pDVar28),iVar31,
                             (ElementCompare *)local_688,0,true);
                }
                iVar31 = *piVar37;
                lVar32 = (long)(int)local_698;
                local_698 = (double)CONCAT44(local_698._4_4_,(int)local_698 + -1);
                *piVar37 = piVar37[lVar32 + -1];
                pDVar28 = (this->m_classSetRows).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_628 = uVar40;
                if (0 < *(int *)((long)&(pDVar33->
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).memused + (long)pDVar28)) {
                  lVar32 = (long)&pDVar33->_vptr_DSVectorBase + (long)pDVar28;
                  lVar39 = 0;
                  lVar27 = 0;
                  local_648 = pDVar33;
                  do {
                    uVar8 = local_268;
                    uVar16 = local_26c;
                    iVar19 = local_270;
                    if (lVar39 != 0) {
                      lVar32 = *(long *)(lVar32 + 8);
                      pnVar29 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  **)(lVar32 + 0x20 + lVar39);
                      local_c8 = *(int **)(lVar32 + lVar39);
                      auStack_c0 = (uint  [2])((undefined8 *)(lVar32 + lVar39))[1];
                      puVar2 = (uint *)(lVar32 + 0x10 + lVar39);
                      local_b8 = *(uint (*) [2])puVar2;
                      uStack_b0 = *(undefined8 *)(puVar2 + 2);
                      iVar47 = *(int *)(lVar32 + 0x28 + lVar39);
                      cVar4 = *(char *)(lVar32 + 0x2c + lVar39);
                      pDVar33 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  **)(lVar32 + 0x30 + lVar39);
                      local_d8 = local_278;
                      uStack_e0 = CONCAT35(uStack_27b,uStack_280);
                      local_e8[0] = auStack_290[2];
                      local_e8[1] = auStack_290[3];
                      local_f8[0] = (uint)local_298;
                      local_f8[1] = local_298._4_4_;
                      auStack_f0[0] = auStack_290[0];
                      auStack_f0[1] = auStack_290[1];
                      local_a8 = pnVar29;
                      epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_68,this);
                      uVar13 = local_268;
                      perm = local_c8;
                      auStack_6d0[0] = auStack_c0[0];
                      auStack_6d0[1] = auStack_c0[1];
                      auStack_6d0[2] = local_b8[0];
                      auStack_6d0[3] = local_b8[1];
                      stack0xfffffffffffff940 = (undefined5)uStack_b0;
                      uStack_6bb = (undefined3)((ulong)uStack_b0 >> 0x28);
                      _local_6b8 = SUB85(local_a8,0);
                      uStack_6b3 = (undefined3)((ulong)local_a8 >> 0x28);
                      factor.m_backend.data._M_elems[0] = local_f8[0];
                      factor.m_backend.data._M_elems[1] = local_f8[1];
                      factor.m_backend.data._M_elems[2] = auStack_f0[0];
                      factor.m_backend.data._M_elems[3] = auStack_f0[1];
                      factor.m_backend.data._M_elems[4] = local_e8[0];
                      factor.m_backend.data._M_elems[5] = local_e8[1];
                      factor.m_backend.data._M_elems._24_5_ = SUB85(uStack_e0,0);
                      factor.m_backend.data._M_elems[7]._1_3_ =
                           (undefined3)((ulong)uStack_e0 >> 0x28);
                      factor.m_backend.data._M_elems._32_5_ = SUB85(local_d8,0);
                      factor.m_backend.data._M_elems[9]._1_3_ =
                           (undefined3)((ulong)local_d8 >> 0x28);
                      factor.m_backend.exp = iVar19;
                      factor.m_backend.neg = (bool)uVar16;
                      local_268._0_4_ = (fpclass_type)uVar8;
                      local_268._4_4_ = SUB84(uVar8,4);
                      factor.m_backend.fpclass = (fpclass_type)local_268;
                      factor.m_backend.prec_elem = local_268._4_4_;
                      local_6b0 = iVar47;
                      local_6ac = (bool)cVar4;
                      local_6a8 = pDVar33;
                      local_268 = uVar13;
                      relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                (&result_2,(soplex *)&perm,&factor,pnVar29);
                      _local_758 = result_2.m_backend.data._M_elems._32_5_;
                      uStack_753 = result_2.m_backend.data._M_elems[9]._1_3_;
                      local_768[0] = result_2.m_backend.data._M_elems[4];
                      local_768[1] = result_2.m_backend.data._M_elems[5];
                      stack0xfffffffffffff8a0 = result_2.m_backend.data._M_elems._24_5_;
                      uStack_75b = result_2.m_backend.data._M_elems[7]._1_3_;
                      auStack_774._4_4_ = result_2.m_backend.data._M_elems[2];
                      auStack_774._8_4_ = result_2.m_backend.data._M_elems[3];
                      old_verbosity = result_2.m_backend.data._M_elems[0];
                      auStack_774._0_4_ = result_2.m_backend.data._M_elems[1];
                      auVar3 = _old_verbosity;
                      local_750 = result_2.m_backend.exp;
                      local_74c = result_2.m_backend.neg;
                      local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)result_2.m_backend._48_8_;
                      if ((result_2.m_backend.neg == true) &&
                         (old_verbosity = result_2.m_backend.data._M_elems[0],
                         old_verbosity != ERROR ||
                         result_2.m_backend.fpclass != cpp_dec_float_finite)) {
                        local_74c = false;
                      }
                      pDVar33 = local_648;
                      this = local_6a0;
                      _old_verbosity = auVar3;
                      if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                          (local_68.fpclass != cpp_dec_float_NaN)) &&
                         (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&local_68
                                          ), pDVar33 = local_648, this = local_6a0, 0 < iVar19)) {
                        iVar31 = *piVar37;
                        lVar32 = (long)(int)local_698;
                        local_698 = (double)CONCAT44(local_698._4_4_,(int)local_698 + -1);
                        *piVar37 = piVar37[lVar32 + -1];
                      }
                    }
                    lVar32 = *(long *)((long)&(pDVar33->
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              ).m_elem +
                                      (long)(this->m_classSetRows).data.
                                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    pClass.data[*(int *)(lVar32 + 0x38 + lVar39)] = iVar31;
                    classSize.data[iVar31] = classSize.data[iVar31] + 1;
                    local_278 = *(undefined8 *)(lVar32 + 0x20 + lVar39);
                    local_298 = *(undefined8 *)(lVar32 + lVar39);
                    auStack_290._0_8_ = *(undefined8 *)((uint *)(lVar32 + lVar39) + 2);
                    auVar3 = *(undefined1 (*) [16])(lVar32 + 0x10 + lVar39);
                    auStack_290._8_8_ = auVar3._0_8_;
                    uStack_280 = auVar3._8_5_;
                    uStack_27b = auVar3._13_3_;
                    local_270 = *(int *)(lVar32 + 0x28 + lVar39);
                    local_26c = *(undefined1 *)(lVar32 + 0x2c + lVar39);
                    local_268 = *(undefined8 *)(lVar32 + 0x30 + lVar39);
                    lVar27 = lVar27 + 1;
                    pDVar28 = (this->m_classSetRows).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    lVar32 = (long)&pDVar33->_vptr_DSVectorBase + (long)pDVar28;
                    lVar39 = lVar39 + 0x3c;
                  } while (lVar27 < *(int *)(lVar32 + 0x14));
                }
                *(undefined4 *)
                 ((long)&(pDVar33->
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).memused + (long)pDVar28) = 0;
                uVar40 = local_628;
              }
              uVar40 = uVar40 + 1;
            } while ((long)uVar40 <
                     (long)(pIVar6->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused);
          }
          lVar32 = local_630 + 1;
        } while (lVar32 < (local_738->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      pSVar35 = local_738;
      free(idxMem);
      idxMem = (int *)0x0;
      iVar31 = (pSVar35->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      remRow.data = (bool *)0x0;
      remRow.memFactor = 1.2;
      remRow.thesize = 0;
      if (0 < iVar31) {
        remRow.thesize = iVar31;
      }
      remRow.themax = 1;
      if (0 < iVar31) {
        remRow.themax = remRow.thesize;
      }
      spx_alloc<bool*>(&remRow.data,remRow.themax);
      auVar3 = _DAT_00601040;
      iVar31 = (pSVar35->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      if (0 < (long)iVar31) {
        pDVar28 = (this->m_dupRows).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar32 = (long)iVar31 + -1;
        auVar43._8_4_ = (int)lVar32;
        auVar43._0_8_ = lVar32;
        auVar43._12_4_ = (int)((ulong)lVar32 >> 0x20);
        lVar32 = 0;
        auVar43 = auVar43 ^ _DAT_00601040;
        auVar44 = _DAT_00601020;
        auVar45 = _DAT_00601030;
        do {
          auVar46 = auVar45 ^ auVar3;
          iVar19 = auVar43._4_4_;
          if ((bool)(~(auVar46._4_4_ == iVar19 && auVar43._0_4_ < auVar46._0_4_ ||
                      iVar19 < auVar46._4_4_) & 1)) {
            *(undefined4 *)
             ((long)&(pDVar28->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).memused + lVar32) = 0;
          }
          if ((auVar46._12_4_ != auVar43._12_4_ || auVar46._8_4_ <= auVar43._8_4_) &&
              auVar46._12_4_ <= auVar43._12_4_) {
            *(undefined4 *)
             ((long)&pDVar28[1].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar32) = 0;
          }
          auVar46 = auVar44 ^ auVar3;
          iVar47 = auVar46._4_4_;
          if (iVar47 <= iVar19 && (iVar47 != iVar19 || auVar46._0_4_ <= auVar43._0_4_)) {
            *(undefined4 *)
             ((long)&pDVar28[2].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar32) = 0;
            *(undefined4 *)
             ((long)&pDVar28[3].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar32) = 0;
          }
          lVar39 = auVar45._8_8_;
          auVar45._0_8_ = auVar45._0_8_ + 4;
          auVar45._8_8_ = lVar39 + 4;
          lVar39 = auVar44._8_8_;
          auVar44._0_8_ = auVar44._0_8_ + 4;
          auVar44._8_8_ = lVar39 + 4;
          lVar32 = lVar32 + 0x80;
        } while ((ulong)(iVar31 + 3U >> 2) << 7 != lVar32);
      }
      uVar36 = (local_738->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      uVar40 = (ulong)uVar36;
      if (0 < (int)uVar36) {
        lVar32 = 0;
        do {
          remRow.data[lVar32] = false;
          iVar31 = pClass.data[lVar32];
          pDVar28 = (this->m_dupRows).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0xa00000000;
          _old_verbosity = (undefined1  [16])0x0;
          local_768[0] = 0;
          local_768[1] = 0;
          stack0xfffffffffffff8a0 = 0;
          uStack_75b = 0;
          _local_758 = 0;
          uStack_753 = 0;
          local_750 = 0;
          local_74c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&old_verbosity,0.0);
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(pDVar28 + iVar31,(int)lVar32,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&old_verbosity);
          lVar32 = lVar32 + 1;
          uVar40 = (ulong)(local_738->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum;
        } while (lVar32 < (long)uVar40);
      }
      perm_tmp = (int *)0x0;
      iVar31 = (int)uVar40;
      spx_alloc<int*>(&perm_tmp,iVar31);
      uVar40 = uVar40 & 0xffffffff;
      if (0 < iVar31) {
        memset(perm_tmp,0,uVar40 * 4);
      }
      pSVar35 = local_738;
      if ((local_738->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum < 1) {
        local_3c8 = 0xffffffff;
        local_4a0 = 0xffffffff;
      }
      else {
        pDVar28 = (this->m_dupRows).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar6 = (local_738->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        pDVar11 = (local_738->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey;
        local_3c8 = 0xffffffff;
        uVar34 = 0;
        uVar36 = 0xffffffff;
        do {
          if ((1 < pDVar28[uVar34].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused) &&
             (pNVar7 = pDVar28[uVar34].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem,
             pIVar6[pDVar11[pNVar7->idx].idx].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused != 1)) {
            if ((int)uVar36 < 0) {
              uVar36 = (uint)uVar34;
            }
            if (1 < pDVar28[uVar34].
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
              piVar37 = &pNVar7[1].idx;
              lVar32 = 1;
              do {
                perm_tmp[*piVar37] = -1;
                lVar32 = lVar32 + 1;
                piVar37 = piVar37 + 0xf;
              } while (lVar32 < pDVar28[uVar34].
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused);
            }
            local_3c8 = uVar34 & 0xffffffff;
          }
          uVar34 = uVar34 + 1;
        } while ((long)uVar34 <
                 (long)(local_738->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
        local_4a0 = (ulong)uVar36;
      }
      if (0 < iVar31) {
        uVar34 = 0;
        iVar19 = 0;
        do {
          if (-1 < perm_tmp[uVar34]) {
            perm_tmp[uVar34] = iVar19;
            iVar19 = iVar19 + 1;
          }
          uVar34 = uVar34 + 1;
        } while (uVar40 != uVar34);
      }
      __x = &(local_738->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector(&newLhsVec.val,&__x->val);
      __x_00 = &(pSVar35->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).right;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector(&newRhsVec.val,&__x_00->val);
      iVar19 = (pSVar35->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      bVar26 = 0 < iVar19;
      if (iVar19 < 1) {
        bVar17 = false;
      }
      else {
        a = *(double *)(in_FS_OFFSET + -8);
        local_698 = -a;
        uStack_690 = 0x8000000000000000;
        local_3d0 = &this->m_hist;
        iVar47 = iVar31;
        iVar19 = iVar31;
        if (iVar31 < 1) {
          iVar47 = 1;
          iVar19 = 0;
        }
        uVar34 = 0;
        bVar17 = false;
        local_3c0 = uVar40;
        do {
          pDVar28 = (this->m_dupRows).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pDVar33 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)(uVar34 * 0x20);
          iVar5 = *(int *)((long)&(pDVar33->
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).memused + (long)pDVar28);
          if ((1 < iVar5) &&
             (local_648 = pDVar33,
             (local_738->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem
             [(local_738->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey
              [*(int *)(*(long *)((long)&(pDVar33->
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).m_elem + (long)pDVar28) + 0x38)].idx].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused != 1)) {
            piVar37 = (this->m_stat).data;
            piVar37[0xc] = iVar5 + piVar37[0xc] + -1;
            ::soplex::infinity::__tls_init();
            local_408.fpclass = cpp_dec_float_finite;
            local_408.prec_elem = 10;
            local_408.data._M_elems[0] = 0;
            local_408.data._M_elems[1] = 0;
            local_408.data._M_elems[2] = 0;
            local_408.data._M_elems[3] = 0;
            local_408.data._M_elems[4] = 0;
            local_408.data._M_elems[5] = 0;
            local_408.data._M_elems._24_5_ = 0;
            local_408.data._M_elems[7]._1_3_ = 0;
            local_408.data._M_elems._32_5_ = 0;
            local_408.data._M_elems[9]._1_3_ = 0;
            local_408.exp = 0;
            local_408.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_408,local_698);
            ::soplex::infinity::__tls_init();
            local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0xa00000000;
            _old_verbosity = ZEXT816(0);
            local_768[0] = 0;
            local_768[1] = 0;
            stack0xfffffffffffff8a0 = 0;
            uStack_75b = 0;
            _local_758 = 0;
            uStack_753 = 0;
            local_750 = 0;
            local_74c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&old_verbosity,a);
            pDVar33 = local_648;
            auVar3 = _old_verbosity;
            local_428[1]._1_3_ = uStack_753;
            local_428._0_5_ = _local_758;
            auStack_430[1]._1_3_ = uStack_75b;
            auStack_430._0_5_ = stack0xfffffffffffff8a0;
            local_438[0] = local_768[0];
            local_438[1] = local_768[1];
            local_448 = _old_verbosity;
            auStack_440[0] = auStack_774._4_4_;
            auStack_440[1] = auStack_774._8_4_;
            local_420 = local_750;
            local_41c = local_74c;
            local_418 = local_748;
            isLhsEqualRhs.themax =
                 *(int *)((long)&(local_648->
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).memused +
                         (long)(this->m_dupRows).data.
                               super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            isLhsEqualRhs.data = (bool *)0x0;
            isLhsEqualRhs.memFactor = 1.2;
            isLhsEqualRhs.thesize = isLhsEqualRhs.themax;
            if (isLhsEqualRhs.themax < 1) {
              isLhsEqualRhs.thesize = 0;
              isLhsEqualRhs.themax = 1;
            }
            _old_verbosity = auVar3;
            spx_alloc<bool*>(&isLhsEqualRhs.data,isLhsEqualRhs.themax);
            pDVar28 = (this->m_dupRows).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_729 = bVar26;
            if (*(int *)((long)&(pDVar33->
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).memused + (long)pDVar28) < 1) {
              iVar5 = -1;
              local_628 = CONCAT44(local_628._4_4_,0xffffffff);
              local_630 = CONCAT44(local_630._4_4_,0xffffffff);
            }
            else {
              lVar32 = (long)&pDVar33->_vptr_DSVectorBase + (long)pDVar28;
              local_630 = CONCAT44(local_630._4_4_,0xffffffff);
              lVar39 = 0x38;
              lVar27 = 0;
              local_628 = CONCAT44(local_628._4_4_,0xffffffff);
              iVar5 = -1;
              do {
                iVar21 = *(int *)(*(long *)(lVar32 + 8) + lVar39);
                pnVar23 = (__x->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar41 = false;
                if ((pnVar23[iVar21].m_backend.fpclass != cpp_dec_float_NaN) &&
                   (pnVar12 = (__x_00->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start, bVar41 = false,
                   pnVar12[iVar21].m_backend.fpclass != cpp_dec_float_NaN)) {
                  iVar20 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&pnVar23[iVar21].m_backend,&pnVar12[iVar21].m_backend);
                  bVar41 = iVar20 == 0;
                }
                isLhsEqualRhs.data[lVar27] = bVar41;
                if (iVar5 == -1) {
                  pnVar23 = (__x->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar8 = *(undefined8 *)(pnVar23[iVar21].m_backend.data._M_elems + 8);
                  local_408.data._M_elems._32_5_ = SUB85(uVar8,0);
                  local_408.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
                  puVar2 = pnVar23[iVar21].m_backend.data._M_elems + 4;
                  uVar8 = *(undefined8 *)(puVar2 + 2);
                  local_408.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                  local_408.data._M_elems._24_5_ = SUB85(uVar8,0);
                  local_408.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
                  local_408.data._M_elems._0_8_ = *(undefined8 *)&pnVar23[iVar21].m_backend.data;
                  local_408.data._M_elems._8_8_ =
                       *(undefined8 *)(pnVar23[iVar21].m_backend.data._M_elems + 2);
                  local_408.exp = pnVar23[iVar21].m_backend.exp;
                  local_408.neg = pnVar23[iVar21].m_backend.neg;
                  local_408.fpclass = pnVar23[iVar21].m_backend.fpclass;
                  local_408.prec_elem = pnVar23[iVar21].m_backend.prec_elem;
                  pnVar23 = (__x_00->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_428 = (uint  [2])
                              *(undefined8 *)(pnVar23[iVar21].m_backend.data._M_elems + 8);
                  puVar2 = pnVar23[iVar21].m_backend.data._M_elems + 4;
                  local_438 = (uint  [2])*(undefined8 *)puVar2;
                  auStack_430 = (uint  [2])*(undefined8 *)(puVar2 + 2);
                  local_448 = *(int **)&pnVar23[iVar21].m_backend.data;
                  auStack_440 = (uint  [2])
                                *(undefined8 *)(pnVar23[iVar21].m_backend.data._M_elems + 2);
                  local_420 = pnVar23[iVar21].m_backend.exp;
                  local_41c = pnVar23[iVar21].m_backend.neg;
                  local_418 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                **)&pnVar23[iVar21].m_backend.fpclass;
                  iVar5 = iVar21;
                }
                else {
                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                  result_2.m_backend.prec_elem = 10;
                  result_2.m_backend.data._M_elems[0] = 0;
                  result_2.m_backend.data._M_elems[1] = 0;
                  result_2.m_backend.data._M_elems[2] = 0;
                  result_2.m_backend.data._M_elems[3] = 0;
                  result_2.m_backend.data._M_elems[4] = 0;
                  result_2.m_backend.data._M_elems[5] = 0;
                  result_2.m_backend.data._M_elems._24_5_ = 0;
                  result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                  result_2.m_backend.data._M_elems._32_5_ = 0;
                  result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                  result_2.m_backend.exp = 0;
                  result_2.m_backend.neg = false;
                  local_6a8 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0xa00000000;
                  perm = (int *)0x0;
                  auStack_6d0[0] = 0;
                  auStack_6d0[1] = 0;
                  auStack_6d0[2] = 0;
                  auStack_6d0[3] = 0;
                  stack0xfffffffffffff940 = 0;
                  uStack_6bb = 0;
                  _local_6b8 = 0;
                  uStack_6b3 = 0;
                  local_6b0 = 0;
                  local_6ac = false;
                  factor.m_backend.fpclass = cpp_dec_float_finite;
                  factor.m_backend.prec_elem = 10;
                  factor.m_backend.data._M_elems[0] = 0;
                  factor.m_backend.data._M_elems[1] = 0;
                  factor.m_backend.data._M_elems[2] = 0;
                  factor.m_backend.data._M_elems[3] = 0;
                  factor.m_backend.data._M_elems[4] = 0;
                  factor.m_backend.data._M_elems[5] = 0;
                  factor.m_backend.data._M_elems._24_5_ = 0;
                  factor.m_backend.data._M_elems[7]._1_3_ = 0;
                  factor.m_backend.data._M_elems._32_5_ = 0;
                  factor.m_backend.data._M_elems[9]._1_3_ = 0;
                  factor.m_backend.exp = 0;
                  factor.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            (&factor.m_backend,
                             &scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend,
                             &scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar21].m_backend);
                  if (factor.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002ea008:
                    pcVar38 = &(__x_00->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar21].m_backend;
                    ::soplex::infinity::__tls_init();
                    local_658 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0xa00000000;
                    local_688._0_4_ = 0;
                    local_688._4_4_ = 0;
                    local_688._8_4_ = 0;
                    local_688._12_4_ = 0;
                    local_688._16_4_ = 0;
                    local_688._20_4_ = 0;
                    local_688._24_5_ = 0;
                    local_688._29_3_ = 0;
                    local_688._32_5_ = 0;
                    local_688._37_3_ = 0;
                    local_688._40_4_ = 0;
                    local_688[0x2c] = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)local_688,a);
                    if (((pcVar38->fpclass == cpp_dec_float_NaN) ||
                        ((fpclass_type)local_658 == cpp_dec_float_NaN)) ||
                       (iVar20 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(pcVar38,(cpp_dec_float<50U,_int,_void> *)local_688),
                       iVar20 < 0)) {
                      pnVar23 = (__x_00->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar21;
                      local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      _old_verbosity = ZEXT816(0);
                      local_768[0] = 0;
                      local_768[1] = 0;
                      stack0xfffffffffffff8a0 = 0;
                      uStack_75b = 0;
                      _local_758 = 0;
                      uStack_753 = 0;
                      local_750 = 0;
                      local_74c = false;
                      if ((pointer)&old_verbosity != pnVar23) {
                        uVar8 = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 8);
                        _local_758 = (undefined5)uVar8;
                        uStack_753 = (undefined3)((ulong)uVar8 >> 0x28);
                        _old_verbosity = *(undefined1 (*) [16])&(pnVar23->m_backend).data;
                        local_768._0_8_ = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 4);
                        uVar8 = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 6);
                        stack0xfffffffffffff8a0 = (undefined5)uVar8;
                        uStack_75b = (undefined3)((ulong)uVar8 >> 0x28);
                        local_750 = (pnVar23->m_backend).exp;
                        local_74c = (pnVar23->m_backend).neg;
                        local_748._0_4_ = (pnVar23->m_backend).fpclass;
                        local_748._4_4_ = (pnVar23->m_backend).prec_elem;
                      }
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&factor.m_backend);
                    }
                    else {
                      ::soplex::infinity::__tls_init();
                      local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      _old_verbosity = ZEXT816(0);
                      local_768[0] = 0;
                      local_768[1] = 0;
                      stack0xfffffffffffff8a0 = 0;
                      uStack_75b = 0;
                      _local_758 = 0;
                      uStack_753 = 0;
                      local_750 = 0;
                      local_74c = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)&old_verbosity,local_698);
                    }
                    auVar3 = _old_verbosity;
                    result_2.m_backend.data._M_elems._32_5_ = _local_758;
                    result_2.m_backend.data._M_elems[9]._1_3_ = uStack_753;
                    result_2.m_backend.data._M_elems[4] = local_768[0];
                    result_2.m_backend.data._M_elems[5] = local_768[1];
                    result_2.m_backend.data._M_elems._24_5_ = stack0xfffffffffffff8a0;
                    result_2.m_backend.data._M_elems[7]._1_3_ = uStack_75b;
                    result_2.m_backend.data._M_elems[0] = old_verbosity;
                    result_2.m_backend.data._M_elems[1] = auStack_774._0_4_;
                    result_2.m_backend.data._M_elems[2] = auStack_774._4_4_;
                    result_2.m_backend.data._M_elems[3] = auStack_774._8_4_;
                    result_2.m_backend.exp = local_750;
                    result_2.m_backend.neg = local_74c;
                    result_2.m_backend._48_8_ = local_748;
                    pcVar38 = &(__x->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar21].m_backend;
                    _old_verbosity = auVar3;
                    ::soplex::infinity::__tls_init();
                    local_658 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0xa00000000;
                    local_688._0_8_ = (int *)0x0;
                    local_688._8_4_ = 0;
                    local_688._12_4_ = 0;
                    local_688._16_4_ = 0;
                    local_688._20_4_ = 0;
                    local_688._24_5_ = 0;
                    local_688._29_3_ = 0;
                    local_688._32_5_ = 0;
                    local_688._37_3_ = 0;
                    local_688._40_4_ = 0;
                    local_688[0x2c] = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)local_688,local_698);
                    if (((pcVar38->fpclass == cpp_dec_float_NaN) ||
                        ((fpclass_type)local_658 == cpp_dec_float_NaN)) ||
                       (iVar20 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(pcVar38,(cpp_dec_float<50U,_int,_void> *)local_688),
                       0 < iVar20)) {
                      pnVar23 = (__x->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar21;
                      local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      _old_verbosity = ZEXT816(0);
                      local_768[0] = 0;
                      local_768[1] = 0;
                      stack0xfffffffffffff8a0 = 0;
                      uStack_75b = 0;
                      _local_758 = 0;
                      uStack_753 = 0;
                      local_750 = 0;
                      local_74c = false;
                      if ((pointer)&old_verbosity != pnVar23) {
                        uVar8 = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 8);
                        _local_758 = (undefined5)uVar8;
                        uStack_753 = (undefined3)((ulong)uVar8 >> 0x28);
                        _old_verbosity = *(undefined1 (*) [16])&(pnVar23->m_backend).data;
                        local_768._0_8_ = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 4);
                        uVar8 = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 6);
                        stack0xfffffffffffff8a0 = (undefined5)uVar8;
                        uStack_75b = (undefined3)((ulong)uVar8 >> 0x28);
                        local_750 = (pnVar23->m_backend).exp;
                        local_74c = (pnVar23->m_backend).neg;
                        local_748 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      **)&(pnVar23->m_backend).fpclass;
                      }
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&factor.m_backend);
                    }
                    else {
                      ::soplex::infinity::__tls_init();
                      local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      _old_verbosity = ZEXT816(0);
                      local_768[0] = 0;
                      local_768[1] = 0;
                      stack0xfffffffffffff8a0 = 0;
                      uStack_75b = 0;
                      _local_758 = 0;
                      uStack_753 = 0;
                      local_750 = 0;
                      local_74c = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)&old_verbosity,a);
                    }
                  }
                  else {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<long_long>
                              ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,0,(type *)0x0);
                    iVar20 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&factor.m_backend,
                                        (cpp_dec_float<50U,_int,_void> *)&old_verbosity);
                    if (iVar20 < 1) goto LAB_002ea008;
                    pcVar38 = &(__x->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar21].m_backend;
                    ::soplex::infinity::__tls_init();
                    local_658 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0xa00000000;
                    local_688._0_4_ = 0;
                    local_688._4_4_ = 0;
                    local_688._8_4_ = 0;
                    local_688._12_4_ = 0;
                    local_688._16_4_ = 0;
                    local_688._20_4_ = 0;
                    local_688._24_5_ = 0;
                    local_688._29_3_ = 0;
                    local_688._32_5_ = 0;
                    local_688._37_3_ = 0;
                    local_688._40_4_ = 0;
                    local_688[0x2c] = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)local_688,local_698);
                    if (((pcVar38->fpclass == cpp_dec_float_NaN) ||
                        ((fpclass_type)local_658 == cpp_dec_float_NaN)) ||
                       (iVar20 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(pcVar38,(cpp_dec_float<50U,_int,_void> *)local_688),
                       0 < iVar20)) {
                      pnVar23 = (__x->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar21;
                      local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      _old_verbosity = ZEXT816(0);
                      local_768[0] = 0;
                      local_768[1] = 0;
                      stack0xfffffffffffff8a0 = 0;
                      uStack_75b = 0;
                      _local_758 = 0;
                      uStack_753 = 0;
                      local_750 = 0;
                      local_74c = false;
                      if ((pointer)&old_verbosity != pnVar23) {
                        uVar8 = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 8);
                        _local_758 = (undefined5)uVar8;
                        uStack_753 = (undefined3)((ulong)uVar8 >> 0x28);
                        _old_verbosity = *(undefined1 (*) [16])&(pnVar23->m_backend).data;
                        local_768._0_8_ = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 4);
                        uVar8 = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 6);
                        stack0xfffffffffffff8a0 = (undefined5)uVar8;
                        uStack_75b = (undefined3)((ulong)uVar8 >> 0x28);
                        local_750 = (pnVar23->m_backend).exp;
                        local_74c = (pnVar23->m_backend).neg;
                        local_748._0_4_ = (pnVar23->m_backend).fpclass;
                        local_748._4_4_ = (pnVar23->m_backend).prec_elem;
                      }
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&factor.m_backend);
                    }
                    else {
                      ::soplex::infinity::__tls_init();
                      local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      _old_verbosity = ZEXT816(0);
                      local_768[0] = 0;
                      local_768[1] = 0;
                      stack0xfffffffffffff8a0 = 0;
                      uStack_75b = 0;
                      _local_758 = 0;
                      uStack_753 = 0;
                      local_750 = 0;
                      local_74c = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)&old_verbosity,local_698);
                    }
                    auVar3 = _old_verbosity;
                    result_2.m_backend.data._M_elems._32_5_ = _local_758;
                    result_2.m_backend.data._M_elems[9]._1_3_ = uStack_753;
                    result_2.m_backend.data._M_elems[4] = local_768[0];
                    result_2.m_backend.data._M_elems[5] = local_768[1];
                    result_2.m_backend.data._M_elems._24_5_ = stack0xfffffffffffff8a0;
                    result_2.m_backend.data._M_elems[7]._1_3_ = uStack_75b;
                    result_2.m_backend.data._M_elems[0] = old_verbosity;
                    result_2.m_backend.data._M_elems[1] = auStack_774._0_4_;
                    result_2.m_backend.data._M_elems[2] = auStack_774._4_4_;
                    result_2.m_backend.data._M_elems[3] = auStack_774._8_4_;
                    result_2.m_backend.exp = local_750;
                    result_2.m_backend.neg = local_74c;
                    result_2.m_backend._48_8_ = local_748;
                    pcVar38 = &(__x_00->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar21].m_backend;
                    _old_verbosity = auVar3;
                    ::soplex::infinity::__tls_init();
                    local_658 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0xa00000000;
                    local_688._0_8_ = (int *)0x0;
                    local_688._8_4_ = 0;
                    local_688._12_4_ = 0;
                    local_688._16_4_ = 0;
                    local_688._20_4_ = 0;
                    local_688._24_5_ = 0;
                    local_688._29_3_ = 0;
                    local_688._32_5_ = 0;
                    local_688._37_3_ = 0;
                    local_688._40_4_ = 0;
                    local_688[0x2c] = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)local_688,a);
                    if (((pcVar38->fpclass == cpp_dec_float_NaN) ||
                        ((fpclass_type)local_658 == cpp_dec_float_NaN)) ||
                       (iVar20 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(pcVar38,(cpp_dec_float<50U,_int,_void> *)local_688),
                       iVar20 < 0)) {
                      pnVar23 = (__x_00->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar21;
                      local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      _old_verbosity = ZEXT816(0);
                      local_768[0] = 0;
                      local_768[1] = 0;
                      stack0xfffffffffffff8a0 = 0;
                      uStack_75b = 0;
                      _local_758 = 0;
                      uStack_753 = 0;
                      local_750 = 0;
                      local_74c = false;
                      if ((pointer)&old_verbosity != pnVar23) {
                        uVar8 = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 8);
                        _local_758 = (undefined5)uVar8;
                        uStack_753 = (undefined3)((ulong)uVar8 >> 0x28);
                        _old_verbosity = *(undefined1 (*) [16])&(pnVar23->m_backend).data;
                        local_768._0_8_ = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 4);
                        uVar8 = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 6);
                        stack0xfffffffffffff8a0 = (undefined5)uVar8;
                        uStack_75b = (undefined3)((ulong)uVar8 >> 0x28);
                        local_750 = (pnVar23->m_backend).exp;
                        local_74c = (pnVar23->m_backend).neg;
                        local_748 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      **)&(pnVar23->m_backend).fpclass;
                      }
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&factor.m_backend);
                    }
                    else {
                      ::soplex::infinity::__tls_init();
                      local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      _old_verbosity = ZEXT816(0);
                      local_768[0] = 0;
                      local_768[1] = 0;
                      stack0xfffffffffffff8a0 = 0;
                      uStack_75b = 0;
                      _local_758 = 0;
                      uStack_753 = 0;
                      local_750 = 0;
                      local_74c = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)&old_verbosity,a);
                    }
                  }
                  auVar3 = _old_verbosity;
                  _local_6b8 = _local_758;
                  uStack_6b3 = uStack_753;
                  auStack_6d0[2] = local_768[0];
                  auStack_6d0[3] = local_768[1];
                  stack0xfffffffffffff940 = stack0xfffffffffffff8a0;
                  uStack_6bb = uStack_75b;
                  perm = _old_verbosity;
                  auStack_6d0[0] = auStack_774._4_4_;
                  auStack_6d0[1] = auStack_774._8_4_;
                  local_6b0 = local_750;
                  local_6ac = local_74c;
                  local_6a8 = local_748;
                  _old_verbosity = auVar3;
                  if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                      (local_408.fpclass != cpp_dec_float_NaN)) &&
                     (iVar20 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&result_2.m_backend,&local_408), 0 < iVar20)) {
                    local_408.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
                    local_408.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
                    local_408.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
                    local_408.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
                    local_408.data._M_elems._24_5_ = result_2.m_backend.data._M_elems._24_5_;
                    local_408.data._M_elems[7]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
                    local_408.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
                    local_408.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
                    local_408.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
                    local_408.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
                    local_408.exp = result_2.m_backend.exp;
                    local_408.neg = result_2.m_backend.neg;
                    local_408.fpclass = result_2.m_backend.fpclass;
                    local_408.prec_elem = result_2.m_backend.prec_elem;
                    local_628 = CONCAT44(local_628._4_4_,iVar21);
                  }
                  if ((((fpclass_type)local_6a8 != cpp_dec_float_NaN) &&
                      ((fpclass_type)local_418 != cpp_dec_float_NaN)) &&
                     (iVar20 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare((cpp_dec_float<50U,_int,_void> *)&perm,
                                       (cpp_dec_float<50U,_int,_void> *)&local_448), iVar20 < 0)) {
                    uVar13._5_3_ = uStack_6b3;
                    uVar13._0_5_ = _local_6b8;
                    local_428[0] = (uint)_local_6b8;
                    local_428[1] = SUB84(uVar13,4);
                    uVar8._5_3_ = uStack_6bb;
                    uVar8._0_5_ = stack0xfffffffffffff940;
                    local_438[0] = auStack_6d0[2];
                    local_438[1] = auStack_6d0[3];
                    auStack_430[0] = (uint)stack0xfffffffffffff940;
                    auStack_430[1] = SUB84(uVar8,4);
                    local_448 = perm;
                    auStack_440[0] = auStack_6d0[0];
                    auStack_440[1] = auStack_6d0[1];
                    local_420 = local_6b0;
                    local_41c = local_6ac;
                    local_418 = local_6a8;
                    local_630 = CONCAT44(local_630._4_4_,iVar21);
                  }
                  remRow.data[iVar21] = true;
                }
                lVar27 = lVar27 + 1;
                lVar32 = (long)&local_648->_vptr_DSVectorBase +
                         (long)(local_6a0->m_dupRows).data.
                               super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                lVar39 = lVar39 + 0x3c;
                this = local_6a0;
              } while (lVar27 < *(int *)(lVar32 + 0x14));
            }
            uVar40 = local_3c0;
            if (iVar5 == -1) {
              bVar41 = true;
            }
            else {
              if ((local_408.fpclass == cpp_dec_float_NaN) ||
                 (pnVar23 = (__x->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 pnVar23[iVar5].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_002ea69f:
                pcVar38 = &(__x->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend;
              }
              else {
                pcVar38 = &local_408;
                iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar38,&pnVar23[iVar5].m_backend);
                if (iVar21 < 1) goto LAB_002ea69f;
              }
              local_4f8 = *(uint (*) [2])((pcVar38->data)._M_elems + 8);
              local_518 = *(int **)(pcVar38->data)._M_elems;
              auStack_510 = *(uint (*) [2])((pcVar38->data)._M_elems + 2);
              local_508 = *(uint (*) [2])((pcVar38->data)._M_elems + 4);
              auStack_500 = *(uint (*) [2])((pcVar38->data)._M_elems + 6);
              local_4f0 = pcVar38->exp;
              local_4ec = pcVar38->neg;
              local_4e8 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            **)&pcVar38->fpclass;
              if (((fpclass_type)local_418 == cpp_dec_float_NaN) ||
                 (pnVar23 = (__x_00->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 pnVar23[iVar5].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_002ea739:
                pnVar29 = (__x_00->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar5;
              }
              else {
                iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)&local_448,
                                    &pnVar23[iVar5].m_backend);
                pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_448;
                uVar40 = local_3c0;
                if (-1 < iVar21) goto LAB_002ea739;
              }
              local_538 = *(uint (*) [2])((pnVar29->m_backend).data._M_elems + 8);
              local_558 = *(int **)(pnVar29->m_backend).data._M_elems;
              auStack_550 = *(uint (*) [2])((pnVar29->m_backend).data._M_elems + 2);
              local_548 = *(uint (*) [2])((pnVar29->m_backend).data._M_elems + 4);
              auStack_540 = *(uint (*) [2])((pnVar29->m_backend).data._M_elems + 6);
              local_530 = (pnVar29->m_backend).exp;
              local_52c = (pnVar29->m_backend).neg;
              local_528 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            **)&(pnVar29->m_backend).fpclass;
              if (uVar34 == local_3c8) {
                da_perm.data = (int *)0x0;
                da_perm.memFactor = 1.2;
                da_perm.themax = iVar47;
                da_perm.thesize = iVar19;
                spx_alloc<int*>(&da_perm.data,iVar47);
                if (0 < iVar31) {
                  uVar30 = 0;
                  do {
                    da_perm.data[uVar30] = perm_tmp[uVar30];
                    uVar30 = uVar30 + 1;
                    pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)da_perm.data;
                  } while (uVar40 != uVar30);
                }
                pDVar24 = (DuplicateRowsPS *)operator_new(0x100);
                pDVar33 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)&local_648->_vptr_DSVectorBase +
                             (long)(this->m_dupRows).data.
                                   super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Array(&local_2b0,&scale);
                DataArray<int>::DataArray(&local_2c8,&da_perm);
                local_480.thesize = isLhsEqualRhs.thesize;
                local_480.themax = isLhsEqualRhs.themax;
                local_480.data = (bool *)0x0;
                local_480.memFactor = isLhsEqualRhs.memFactor;
                spx_alloc<bool*>(&local_480.data,isLhsEqualRhs.themax);
                local_648 = pDVar33;
                if ((ulong)(uint)local_480.thesize != 0) {
                  memcpy(local_480.data,isLhsEqualRhs.data,(ulong)(uint)local_480.thesize);
                }
                pDVar15 = local_4e8;
                bVar14 = local_4ec;
                iVar20 = local_4f0;
                pDVar33 = local_528;
                bVar41 = local_52c;
                iVar21 = local_530;
                local_108[0] = local_4f8[0];
                local_108[1] = local_4f8[1];
                local_118[0] = local_508[0];
                local_118[1] = local_508[1];
                auStack_110[0] = auStack_500[0];
                auStack_110[1] = auStack_500[1];
                local_128 = local_518;
                auStack_120[0] = auStack_510[0];
                auStack_120[1] = auStack_510[1];
                local_138[0] = local_538[0];
                local_138[1] = local_538[1];
                local_148[0] = local_548[0];
                local_148[1] = local_548[1];
                auStack_140[0] = auStack_540[0];
                auStack_140[1] = auStack_540[1];
                local_158 = local_558;
                auStack_150[0] = auStack_550[0];
                auStack_150[1] = auStack_550[1];
                pTVar9 = (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var10 = (this->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                  }
                }
                RVar42 = Tolerances::epsilon(pTVar9);
                factor.m_backend.data._M_elems._0_8_ = local_128;
                factor.m_backend.data._M_elems[2] = auStack_120[0];
                factor.m_backend.data._M_elems[3] = auStack_120[1];
                factor.m_backend.data._M_elems[4] = local_118[0];
                factor.m_backend.data._M_elems[5] = local_118[1];
                factor.m_backend.data._M_elems._24_5_ = auStack_110._0_5_;
                factor.m_backend.data._M_elems[7]._1_3_ = auStack_110[1]._1_3_;
                factor.m_backend.data._M_elems._32_5_ = SUB85(local_108._0_8_,0);
                factor.m_backend.data._M_elems[9]._1_3_ = SUB83(local_108._0_8_,5);
                factor.m_backend.exp = iVar20;
                factor.m_backend.neg = bVar14;
                factor.m_backend._48_8_ = pDVar15;
                local_688._0_8_ = local_158;
                local_688._8_4_ = auStack_150[0];
                local_688._12_4_ = auStack_150[1];
                local_688._16_4_ = local_148[0];
                local_688._20_4_ = local_148[1];
                local_688._24_5_ = auStack_140._0_5_;
                local_688._29_3_ = auStack_140[1]._1_3_;
                local_688._32_5_ = (undefined5)local_138._0_8_;
                local_688._37_3_ = SUB83(local_138._0_8_,5);
                local_688._40_4_ = iVar21;
                local_688[0x2c] = bVar41;
                local_658 = pDVar33;
                relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&perm,(soplex *)&factor,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_688,pnVar29);
                result_2.m_backend.data._M_elems._32_5_ = _local_6b8;
                result_2.m_backend.data._M_elems[9]._1_3_ = uStack_6b3;
                result_2.m_backend.data._M_elems[4] = auStack_6d0[2];
                result_2.m_backend.data._M_elems[5] = auStack_6d0[3];
                result_2.m_backend.data._M_elems._24_5_ = stack0xfffffffffffff940;
                result_2.m_backend.data._M_elems[7]._1_3_ = uStack_6bb;
                result_2.m_backend.data._M_elems._0_8_ = perm;
                uVar8 = result_2.m_backend.data._M_elems._0_8_;
                result_2.m_backend.data._M_elems[2] = auStack_6d0[0];
                result_2.m_backend.data._M_elems[3] = auStack_6d0[1];
                result_2.m_backend.exp = local_6b0;
                result_2.m_backend.neg = local_6ac;
                result_2.m_backend._48_8_ = local_6a8;
                if ((local_6ac == true) &&
                   (result_2.m_backend.data._M_elems[0] = (uint)perm,
                   result_2.m_backend.data._M_elems[0] != 0 || (int)local_6a8 != 0)) {
                  result_2.m_backend.neg = false;
                }
                result_2.m_backend.data._M_elems._0_8_ = uVar8;
                if (NAN(RVar42) || (int)local_6a8 == 2) {
                  bVar41 = false;
                }
                else {
                  local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0xa00000000;
                  _old_verbosity = ZEXT816(0);
                  local_768[0] = 0;
                  local_768[1] = 0;
                  stack0xfffffffffffff8a0 = 0;
                  uStack_75b = 0;
                  _local_758 = 0;
                  uStack_753 = 0;
                  local_750 = 0;
                  local_74c = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&old_verbosity,RVar42);
                  iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&result_2.m_backend,
                                      (cpp_dec_float<50U,_int,_void> *)&old_verbosity);
                  bVar41 = iVar21 < 1;
                }
                local_378.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_378.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
                if (local_378.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_378.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_378.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_378.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_378.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)(local_628 & 0xffffffff);
                DuplicateRowsPS::DuplicateRowsPS
                          (pDVar24,local_738,iVar5,(int)local_628,(int)local_630,local_648,
                           &local_2b0,&local_2c8,&local_480,true,bVar41,&local_378,
                           uVar34 == local_4a0);
                ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pDVar24;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS*>
                          (&ptr.
                            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,pDVar24);
                if (local_378.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_378.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
                }
                if (local_480.data != (bool *)0x0) {
                  free(local_480.data);
                  local_480.data = (bool *)0x0;
                }
                if (local_2c8.data != (int *)0x0) {
                  free(local_2c8.data);
                  local_2c8.data = (int *)0x0;
                }
                if (local_2b0.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_2b0.data.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_2b0.data.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_2b0.data.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                ::push_back(&local_3d0->data,&ptr);
                if (ptr.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (ptr.
                             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
              }
              else {
                da_perm.data = (int *)0x0;
                da_perm.memFactor = 1.2;
                da_perm.thesize = 0;
                da_perm.themax = 1;
                spx_alloc<int*>(&da_perm.data,1);
                pDVar24 = (DuplicateRowsPS *)operator_new(0x100);
                pDVar33 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)&local_648->_vptr_DSVectorBase +
                             (long)(this->m_dupRows).data.
                                   super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Array(&local_2e0,&scale);
                DataArray<int>::DataArray(&local_2f8,&da_perm);
                local_498.thesize = isLhsEqualRhs.thesize;
                local_498.themax = isLhsEqualRhs.themax;
                local_498.data = (bool *)0x0;
                local_498.memFactor = isLhsEqualRhs.memFactor;
                spx_alloc<bool*>(&local_498.data,isLhsEqualRhs.themax);
                local_648 = pDVar33;
                if ((ulong)(uint)local_498.thesize != 0) {
                  memcpy(local_498.data,isLhsEqualRhs.data,(ulong)(uint)local_498.thesize);
                }
                pDVar15 = local_4e8;
                bVar14 = local_4ec;
                iVar20 = local_4f0;
                pDVar33 = local_528;
                bVar41 = local_52c;
                iVar21 = local_530;
                local_168[0] = local_4f8[0];
                local_168[1] = local_4f8[1];
                local_178[0] = local_508[0];
                local_178[1] = local_508[1];
                auStack_170[0] = auStack_500[0];
                auStack_170[1] = auStack_500[1];
                local_188 = local_518;
                auStack_180[0] = auStack_510[0];
                auStack_180[1] = auStack_510[1];
                local_198[0] = local_538[0];
                local_198[1] = local_538[1];
                local_1a8[0] = local_548[0];
                local_1a8[1] = local_548[1];
                auStack_1a0[0] = auStack_540[0];
                auStack_1a0[1] = auStack_540[1];
                local_1b8 = local_558;
                auStack_1b0[0] = auStack_550[0];
                auStack_1b0[1] = auStack_550[1];
                pTVar9 = (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var10 = (this->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                  }
                }
                RVar42 = Tolerances::epsilon(pTVar9);
                factor.m_backend.data._M_elems._0_8_ = local_188;
                factor.m_backend.data._M_elems[2] = auStack_180[0];
                factor.m_backend.data._M_elems[3] = auStack_180[1];
                factor.m_backend.data._M_elems[4] = local_178[0];
                factor.m_backend.data._M_elems[5] = local_178[1];
                factor.m_backend.data._M_elems._24_5_ = auStack_170._0_5_;
                factor.m_backend.data._M_elems[7]._1_3_ = auStack_170[1]._1_3_;
                factor.m_backend.data._M_elems._32_5_ = SUB85(local_168._0_8_,0);
                factor.m_backend.data._M_elems[9]._1_3_ = SUB83(local_168._0_8_,5);
                factor.m_backend.exp = iVar20;
                factor.m_backend.neg = bVar14;
                factor.m_backend._48_8_ = pDVar15;
                local_688._0_8_ = local_1b8;
                local_688._8_4_ = auStack_1b0[0];
                local_688._12_4_ = auStack_1b0[1];
                local_688._16_4_ = local_1a8[0];
                local_688._20_4_ = local_1a8[1];
                local_688._24_5_ = auStack_1a0._0_5_;
                local_688._29_3_ = auStack_1a0[1]._1_3_;
                local_688._32_5_ = (undefined5)local_198._0_8_;
                local_688._37_3_ = SUB83(local_198._0_8_,5);
                local_688._40_4_ = iVar21;
                local_688[0x2c] = bVar41;
                local_658 = pDVar33;
                relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&perm,(soplex *)&factor,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_688,pnVar29);
                result_2.m_backend.data._M_elems._32_5_ = _local_6b8;
                result_2.m_backend.data._M_elems[9]._1_3_ = uStack_6b3;
                result_2.m_backend.data._M_elems[4] = auStack_6d0[2];
                result_2.m_backend.data._M_elems[5] = auStack_6d0[3];
                result_2.m_backend.data._M_elems._24_5_ = stack0xfffffffffffff940;
                result_2.m_backend.data._M_elems[7]._1_3_ = uStack_6bb;
                result_2.m_backend.data._M_elems._0_8_ = perm;
                uVar8 = result_2.m_backend.data._M_elems._0_8_;
                result_2.m_backend.data._M_elems[2] = auStack_6d0[0];
                result_2.m_backend.data._M_elems[3] = auStack_6d0[1];
                result_2.m_backend.exp = local_6b0;
                result_2.m_backend.neg = local_6ac;
                result_2.m_backend._48_8_ = local_6a8;
                if ((local_6ac == true) &&
                   (result_2.m_backend.data._M_elems[0] = (uint)perm,
                   result_2.m_backend.data._M_elems[0] != 0 || (int)local_6a8 != 0)) {
                  result_2.m_backend.neg = false;
                }
                result_2.m_backend.data._M_elems._0_8_ = uVar8;
                if (NAN(RVar42) || (int)local_6a8 == 2) {
                  bVar41 = false;
                }
                else {
                  local_748 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0xa00000000;
                  _old_verbosity = ZEXT816(0);
                  local_768[0] = 0;
                  local_768[1] = 0;
                  stack0xfffffffffffff8a0 = 0;
                  uStack_75b = 0;
                  _local_758 = 0;
                  uStack_753 = 0;
                  local_750 = 0;
                  local_74c = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&old_verbosity,RVar42);
                  iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&result_2.m_backend,
                                      (cpp_dec_float<50U,_int,_void> *)&old_verbosity);
                  bVar41 = iVar21 < 1;
                }
                local_388.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_388.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
                if (local_388.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_388.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_388.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_388.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_388.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)(local_628 & 0xffffffff);
                DuplicateRowsPS::DuplicateRowsPS
                          (pDVar24,local_738,iVar5,(int)local_628,(int)local_630,local_648,
                           &local_2e0,&local_2f8,&local_498,false,bVar41,&local_388,
                           uVar34 == local_4a0);
                ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pDVar24;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS*>
                          (&ptr.
                            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,pDVar24);
                if (local_388.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_388.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
                }
                if (local_498.data != (bool *)0x0) {
                  free(local_498.data);
                  local_498.data = (bool *)0x0;
                }
                if (local_2f8.data != (int *)0x0) {
                  free(local_2f8.data);
                  local_2f8.data = (int *)0x0;
                }
                if (local_2e0.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_2e0.data.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_2e0.data.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_2e0.data.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                ::push_back(&local_3d0->data,&ptr);
                if (ptr.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (ptr.
                             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
              }
              if (da_perm.data != (int *)0x0) {
                free(da_perm.data);
                da_perm.data = (int *)0x0;
              }
              if (((local_408.fpclass == cpp_dec_float_NaN) ||
                  (pnVar23 = (__x->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                  pnVar23[iVar5].m_backend.fpclass == cpp_dec_float_NaN)) ||
                 (iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_408,&pnVar23[iVar5].m_backend), iVar21 < 1)) {
                bVar41 = true;
                if ((((fpclass_type)local_418 == cpp_dec_float_NaN) ||
                    (pnVar23 = (__x_00->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                    pnVar23[iVar5].m_backend.fpclass == cpp_dec_float_NaN)) ||
                   (iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)&local_448,
                                        &pnVar23[iVar5].m_backend), -1 < iVar21)) goto LAB_002eb605;
              }
              bVar41 = local_4ec;
              iVar20 = local_4f0;
              pDVar33 = local_528;
              bVar17 = local_52c;
              iVar21 = local_530;
              local_1c8[0] = local_538[0];
              local_1c8[1] = local_538[1];
              local_1d8[0] = local_548[0];
              local_1d8[1] = local_548[1];
              auStack_1d0[0] = auStack_540[0];
              auStack_1d0[1] = auStack_540[1];
              local_1e8 = local_558;
              auStack_1e0[0] = auStack_550[0];
              auStack_1e0[1] = auStack_550[1];
              local_218 = local_518;
              auStack_210[0] = auStack_510[0];
              auStack_210[1] = auStack_510[1];
              local_208[0] = local_508[0];
              local_208[1] = local_508[1];
              auStack_200[0] = auStack_500[0];
              auStack_200[1] = auStack_500[1];
              local_1f8[0] = local_4f8[0];
              local_1f8[1] = local_4f8[1];
              local_648 = local_4e8;
              uStack_640 = 0;
              feastol(&local_a0,this);
              result_2.m_backend.data._M_elems._0_8_ = local_1e8;
              result_2.m_backend.data._M_elems[2] = auStack_1e0[0];
              result_2.m_backend.data._M_elems[3] = auStack_1e0[1];
              result_2.m_backend.data._M_elems[4] = local_1d8[0];
              result_2.m_backend.data._M_elems[5] = local_1d8[1];
              result_2.m_backend.data._M_elems._24_5_ = auStack_1d0._0_5_;
              result_2.m_backend.data._M_elems[7]._1_3_ = auStack_1d0[1]._1_3_;
              result_2.m_backend.data._M_elems._32_5_ = SUB85(local_1c8._0_8_,0);
              result_2.m_backend.data._M_elems[9]._1_3_ = SUB83(local_1c8._0_8_,5);
              result_2.m_backend.exp = iVar21;
              result_2.m_backend.neg = bVar17;
              result_2.m_backend._48_8_ = pDVar33;
              perm = local_218;
              auStack_6d0[0] = auStack_210[0];
              auStack_6d0[1] = auStack_210[1];
              auStack_6d0[2] = local_208[0];
              auStack_6d0[3] = local_208[1];
              stack0xfffffffffffff940 = auStack_200._0_5_;
              uStack_6bb = auStack_200[1]._1_3_;
              _local_6b8 = (undefined5)local_1f8._0_8_;
              uStack_6b3 = SUB83(local_1f8._0_8_,5);
              local_6b0 = iVar20;
              local_6ac = bVar41;
              local_6a8 = local_648;
              relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity,(soplex *)&result_2,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&perm,pnVar29);
              factor.m_backend.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
              factor.m_backend.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
              uVar8 = factor.m_backend.data._M_elems._0_8_;
              factor.m_backend.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
              factor.m_backend.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
              factor.m_backend.data._M_elems._32_5_ = local_a0.m_backend.data._M_elems._32_5_;
              factor.m_backend.data._M_elems[9]._1_3_ = local_a0.m_backend.data._M_elems[9]._1_3_;
              factor.m_backend.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
              factor.m_backend.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
              factor.m_backend.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
              factor.m_backend.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
              factor.m_backend.exp = local_a0.m_backend.exp;
              factor.m_backend.neg = local_a0.m_backend.neg;
              factor.m_backend.fpclass = local_a0.m_backend.fpclass;
              factor.m_backend.prec_elem = local_a0.m_backend.prec_elem;
              factor.m_backend.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
              if (factor.m_backend.data._M_elems[0] != 0 ||
                  local_a0.m_backend.fpclass != cpp_dec_float_finite) {
                factor.m_backend.neg = (bool)(local_a0.m_backend.neg ^ 1);
              }
              factor.m_backend.data._M_elems._0_8_ = uVar8;
              if (((local_a0.m_backend.fpclass == cpp_dec_float_NaN) ||
                  ((fpclass_type)local_748 == cpp_dec_float_NaN)) ||
                 (iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,
                                      &factor.m_backend), 0 < iVar21)) {
                if ((((fpclass_type)local_528 != cpp_dec_float_NaN) &&
                    ((fpclass_type)local_4e8 != cpp_dec_float_NaN)) &&
                   (iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)&local_558,
                                        (cpp_dec_float<50U,_int,_void> *)&local_518), iVar21 < 0)) {
                  local_538[0] = local_4f8[0];
                  local_538[1] = local_4f8[1];
                  local_548[0] = local_508[0];
                  local_548[1] = local_508[1];
                  auStack_540[0] = auStack_500[0];
                  auStack_540[1] = auStack_500[1];
                  local_558 = local_518;
                  auStack_550[0] = auStack_510[0];
                  auStack_550[1] = auStack_510[1];
                  local_530 = local_4f0;
                  local_52c = local_4ec;
                  local_528 = local_4e8;
                }
                *(uint (*) [2])
                 (newLhsVec.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.data._M_elems + 8) =
                     local_4f8;
                puVar2 = newLhsVec.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.data._M_elems +
                         4;
                *(uint (*) [2])puVar2 = local_508;
                *(uint (*) [2])(puVar2 + 2) = auStack_500;
                *(int **)newLhsVec.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.data._M_elems =
                     local_518;
                *(uint (*) [2])
                 (newLhsVec.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.data._M_elems + 2) =
                     auStack_510;
                newLhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.exp = local_4f0;
                newLhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.neg = local_4ec;
                *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)&newLhsVec.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.fpclass = local_4e8
                ;
                *(uint (*) [2])
                 (newRhsVec.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.data._M_elems + 8) =
                     local_538;
                puVar2 = newRhsVec.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.data._M_elems +
                         4;
                *(uint (*) [2])puVar2 = local_548;
                *(uint (*) [2])(puVar2 + 2) = auStack_540;
                *(int **)newRhsVec.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.data._M_elems =
                     local_558;
                *(uint (*) [2])
                 (newRhsVec.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.data._M_elems + 2) =
                     auStack_550;
                newRhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.exp = local_530;
                newRhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.neg = local_52c;
                *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)&newRhsVec.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend.fpclass = local_528
                ;
                bVar41 = true;
                bVar17 = true;
              }
              else {
                free(perm_tmp);
                perm_tmp = (int *)0x0;
                bVar17 = true;
                bVar41 = false;
              }
            }
LAB_002eb605:
            if (isLhsEqualRhs.data != (bool *)0x0) {
              free(isLhsEqualRhs.data);
              isLhsEqualRhs.data = (bool *)0x0;
            }
            pSVar35 = local_738;
            bVar26 = local_729;
            if (!bVar41) break;
          }
          uVar34 = uVar34 + 1;
          lVar32 = (long)(local_738->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum;
          bVar26 = (long)uVar34 < lVar32;
          pSVar35 = local_738;
        } while ((long)uVar34 < lVar32);
      }
      RVar18 = INFEASIBLE;
      if ((bVar26 & 1) == 0) {
        if (bVar17) {
          (*(pSVar35->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x38])(pSVar35,&newLhsVec,&newRhsVec,0);
          pSVar35 = local_738;
        }
        uVar36 = (pSVar35->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        perm = (int *)0x0;
        spx_alloc<int*>(&perm,uVar36);
        if ((int)uVar36 < 1) {
          iVar31 = 0;
          iVar19 = 0;
        }
        else {
          pIVar6 = (local_738->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem;
          pDVar11 = (local_738->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thekey;
          uVar40 = 0;
          iVar19 = 0;
          iVar31 = 0;
          do {
            if (remRow.data[uVar40] == true) {
              perm[uVar40] = -1;
              iVar31 = iVar31 + 1;
              iVar19 = iVar19 + pIVar6[pDVar11[uVar40].idx].data.
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused;
            }
            else {
              perm[uVar40] = 0;
            }
            uVar40 = uVar40 + 1;
          } while (uVar36 != uVar40);
        }
        (*(local_738->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x11])(local_738,perm);
        if (0 < (int)uVar36) {
          piVar37 = (this->m_rIdx).data;
          uVar40 = 0;
          do {
            if (-1 < (long)perm[uVar40]) {
              piVar37[perm[uVar40]] = piVar37[uVar40];
            }
            uVar40 = uVar40 + 1;
          } while (uVar36 != uVar40);
        }
        free(perm);
        RVar18 = OKAY;
        perm = (int *)0x0;
        free(perm_tmp);
        perm_tmp = (int *)0x0;
        if (iVar19 + iVar31 != 0 && SCARRY4(iVar19,iVar31) == iVar19 + iVar31 < 0) {
          piVar37 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remRows;
          *piVar37 = *piVar37 + iVar31;
          piVar37 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remNzos;
          *piVar37 = *piVar37 + iVar19;
          pSVar25 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          if ((pSVar25 != (SPxOut *)0x0) && (3 < (int)pSVar25->m_verbosity)) {
            old_verbosity = pSVar25->m_verbosity;
            result_2.m_backend.data._M_elems[0] = 4;
            (*pSVar25->_vptr_SPxOut[2])();
            pSVar25 = soplex::operator<<((this->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).spxout,"Simplifier (duplicate rows) removed ");
            std::ostream::operator<<((ostream *)pSVar25->m_streams[pSVar25->m_verbosity],iVar31);
            pSVar25 = soplex::operator<<(pSVar25," rows, ");
            std::ostream::operator<<((ostream *)pSVar25->m_streams[pSVar25->m_verbosity],iVar19);
            pSVar25 = soplex::operator<<(pSVar25," non-zeros");
            std::endl<char,std::char_traits<char>>(pSVar25->m_streams[pSVar25->m_verbosity]);
            pSVar25 = (this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            (*pSVar25->_vptr_SPxOut[2])(pSVar25,&old_verbosity);
          }
          result_2.m_backend.fpclass = cpp_dec_float_finite;
          result_2.m_backend.prec_elem = 10;
          result_2.m_backend.data._M_elems[0] = 0;
          result_2.m_backend.data._M_elems[1] = 0;
          result_2.m_backend.data._M_elems[2] = 0;
          result_2.m_backend.data._M_elems[3] = 0;
          result_2.m_backend.data._M_elems[4] = 0;
          result_2.m_backend.data._M_elems[5] = 0;
          result_2.m_backend.data._M_elems._24_5_ = 0;
          result_2.m_backend.data._M_elems[7]._1_3_ = 0;
          result_2.m_backend.data._M_elems._32_5_ = 0;
          result_2.m_backend.data._M_elems[9]._1_3_ = 0;
          result_2.m_backend.exp = 0;
          result_2.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,(long)iVar22,(type *)0x0);
          pnVar29 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_minReduction;
          if (&result_2 != pnVar29) {
            uVar8 = *(undefined8 *)
                     ((this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_minReduction.m_backend.data._M_elems + 8);
            result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar8,0);
            result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            result_2.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)(pnVar29->m_backend).data._M_elems;
            result_2.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)
                  ((this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_minReduction.m_backend.data._M_elems + 2);
            result_2.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)
                  ((this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_minReduction.m_backend.data._M_elems + 4);
            uVar8 = *(undefined8 *)
                     ((this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_minReduction.m_backend.data._M_elems + 6);
            result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar8,0);
            result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            result_2.m_backend.exp =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.exp;
            result_2.m_backend.neg =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.neg;
            result_2.m_backend.fpclass =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.fpclass;
            result_2.m_backend.prec_elem =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)&old_verbosity);
          if (result_2.m_backend.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,(long)iVar31,(type *)0x0);
            iVar22 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)&old_verbosity)
            ;
            if (iVar22 < 0) {
              *again = true;
            }
          }
        }
      }
      if (newRhsVec.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(newRhsVec.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)newRhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)newRhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (newLhsVec.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(newLhsVec.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)newLhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)newLhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (remRow.data != (bool *)0x0) {
        free(remRow.data);
        remRow.data = (bool *)0x0;
      }
      if (scale.data.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scale.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (classSize.data != (int *)0x0) {
        free(classSize.data);
        classSize.data = (int *)0x0;
      }
      if (pClass.data != (int *)0x0) {
        free(pClass.data);
      }
    }
  }
  return RVar18;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateRows(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate rows
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   // Possible extension: use generalized definition of duplicate rows according to Andersen and Andersen
   // However: the resulting sparsification is often very small since the involved rows are usually very sparse

   int remRows = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

#if SOPLEX_ROW_SINGLETON
   int rs_remRows = 0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 1)
      {
         removeRowSingleton(lp, row, i);
         rs_remRows++;
      }
   }

   if(rs_remRows > 0)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) <<
                    "Simplifier duplicate rows (row singleton stage) removed "
                    << rs_remRows << " rows, "
                    << rs_remRows << " non-zeros"
                    << std::endl;)
   }

#endif

   if(lp.nRows() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nRows());           // class of parallel rows
   DataArray<int>    classSize(lp.nRows());        // size of each class
   Array<R>   scale(lp.nRows());            // scaling factor for each row
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nRows());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nRows(), idxMem);           // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nRows();

   for(int i = 1; i < lp.nRows(); ++i)
   {
      pClass[i] = 0;
      scale[i]  = 0.0;
      classSize[i] = 0;
      idxSet.addIdx(i);
   }

   R oldVal = 0.0;

   // main loop
   for(int j = 0; j < lp.nCols(); ++j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);
         int  i   = col.index(k);

         if(scale[i] == 0.0)
            scale[i] = aij;

         m_classSetRows[pClass[i]].add(i, aij / scale[i]);

         if(--classSize[pClass[i]] == 0)
            idxSet.addIdx(pClass[i]);
      }

      // update each parallel class with non-zero column entry
      for(int m = 0; m < col.size(); ++m)
      {
         int k = pClass[col.index(m)];

         if(m_classSetRows[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled column values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetRows[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetRows[k].hasNaNs());
               assert(!m_classSetRows[k].hasInfs());
               SPxQuicksort(m_classSetRows[k].mem(), m_classSetRows[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetRows[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetRows[k].value(l), oldVal, this->epsZero()))
               {
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetRows[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetRows[k].value(l);
            }

            m_classSetRows[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remRow(lp.nRows());

   for(int k = 0; k < lp.nRows(); ++k)
      m_dupRows[k].clear();

   for(int k = 0; k < lp.nRows(); ++k)
   {
      remRow[k] = false;
      m_dupRows[pClass[k]].add(k, 0.0);
   }

   const int nRowsOld_tmp = lp.nRows();
   int* perm_tmp = nullptr;
   spx_alloc(perm_tmp, nRowsOld_tmp);

   for(int j = 0; j < nRowsOld_tmp; ++j)
   {
      perm_tmp[j] = 0;
   }

   int idxFirstDupRows = -1;
   int idxLastDupRows = -1;
   int numDelRows = 0;

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         idxLastDupRows = k;

         if(idxFirstDupRows < 0)
         {
            idxFirstDupRows = k;
         }

         for(int l = 1; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            perm_tmp[i] = -1;
         }

         numDelRows += (m_dupRows[k].size() - 1);
      }
   }

   {
      int k_tmp, j_tmp = -1;

      for(k_tmp = j_tmp = 0; k_tmp < nRowsOld_tmp; ++k_tmp)
      {
         if(perm_tmp[k_tmp] >= 0)
            perm_tmp[k_tmp] = j_tmp++;
      }
   }

   // store rhs and lhs changes for combined update
   bool doChangeRanges = false;
   VectorBase<R> newLhsVec(lp.lhs());
   VectorBase<R> newRhsVec(lp.rhs());

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM53 {} duplicate rows found\n", m_dupRows[k].size());

         m_stat[DUPLICATE_ROW] += m_dupRows[k].size() - 1;

         // index of one non-column singleton row in dupRows[k]
         int  rowIdx    = -1;
         int  maxLhsIdx = -1;
         int  minRhsIdx = -1;
         R maxLhs    = R(-infinity);
         R minRhs    = +R(infinity);

         DataArray<bool> isLhsEqualRhs(m_dupRows[k].size());

         // determine strictest bounds on constraint
         for(int l = 0; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            isLhsEqualRhs[l] = (lp.lhs(i) == lp.rhs(i));

            SOPLEX_ASSERT_WARN("WMAISM54", isNotZero(scale[i], R(1.0 / R(infinity))));

            if(rowIdx == -1)
            {
               rowIdx = i;
               maxLhs = lp.lhs(rowIdx);
               minRhs = lp.rhs(rowIdx);
            }
            else
            {
               R scaledLhs, scaledRhs;
               R factor = scale[rowIdx] / scale[i];

               if(factor > 0)
               {
                  scaledLhs = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) * factor;
                  scaledRhs = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) * factor;
               }
               else
               {
                  scaledLhs = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) * factor;
                  scaledRhs = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) * factor;
               }

               if(scaledLhs > maxLhs)
               {
                  maxLhs    = scaledLhs;
                  maxLhsIdx = i;
               }

               if(scaledRhs < minRhs)
               {
                  minRhs    = scaledRhs;
                  minRhsIdx = i;
               }

               remRow[i] = true;
            }
         }

         if(rowIdx != -1)
         {
            R newLhs = (maxLhs > lp.lhs(rowIdx)) ? maxLhs : lp.lhs(rowIdx);
            R newRhs = (minRhs < lp.rhs(rowIdx)) ? minRhs : lp.rhs(rowIdx);

            if(k == idxLastDupRows)
            {
               DataArray<int> da_perm(nRowsOld_tmp);

               for(int j = 0; j < nRowsOld_tmp; ++j)
               {
                  da_perm[j] = perm_tmp[j];
               }

               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm, isLhsEqualRhs, true,
                                             EQrel(newLhs, newRhs, this->tolerances()->epsilon()), this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }
            else
            {
               DataArray<int> da_perm_empty(0);
               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm_empty, isLhsEqualRhs, false, EQrel(newLhs, newRhs,
                                                   this->tolerances()->epsilon()),
                                             this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }

            if(maxLhs > lp.lhs(rowIdx) || minRhs < lp.rhs(rowIdx))
            {
               // modify lhs and rhs of constraint rowIdx
               doChangeRanges = true;

               if(LTrel(newRhs, newLhs, feastol()))
               {
                  SPxOut::debug(this, "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n", newLhs,
                                newRhs);
                  spx_free(perm_tmp);
                  return this->INFEASIBLE;
               }

               // if we accept the infeasibility we should clean up the values to avoid problems later
               if(newRhs < newLhs)
                  newRhs = newLhs;

               newLhsVec[rowIdx] = newLhs;
               newRhsVec[rowIdx] = newRhs;
            }
         }
      }
   }

   // change ranges for all modified constraints by one single call (more efficient)
   if(doChangeRanges)
   {
      lp.changeRange(newLhsVec, newRhsVec);
   }

   // remove all rows by one single method call (more efficient)
   const int nRowsOld = lp.nRows();
   int* perm = nullptr;
   spx_alloc(perm, nRowsOld);

   for(int i = 0; i < nRowsOld; ++i)
   {
      if(remRow[i])
      {
         perm[i] = -1;
         ++remRows;
         remNzos += lp.rowVector(i).size();
      }
      else
         perm[i] = 0;
   }

   lp.removeRows(perm);

   for(int i = 0; i < nRowsOld; ++i)
   {
      // assert that the pre-computed permutation was correct
      assert(perm[i] == perm_tmp[i]);

      // update the global index mapping
      if(perm[i] >= 0)
         m_rIdx[perm[i]] = m_rIdx[i];
   }

   spx_free(perm);
   spx_free(perm_tmp);

   if(remRows + remNzos > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate rows) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remRows > this->m_minReduction * oldRows)
         again = true;

   }

   return this->OKAY;
}